

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv__print_handles(uv_loop_t *loop,int only_active,void *stream)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uint uVar3;
  char *pcVar4;
  
  if ((loop == (uv_loop_t *)0x0) && (loop = default_loop_ptr, default_loop_ptr == (uv_loop_t *)0x0))
  {
    loop = &default_loop_struct;
    uv_loop_init(&default_loop_struct);
    default_loop_ptr = &default_loop_struct;
  }
  if (stream == (void *)0x0) {
    stream = _stderr;
  }
  for (puVar1 = (loop->handle_queue).next; puVar1 != &loop->handle_queue; puVar1 = puVar1->next) {
    if ((only_active == 0) || (((ulong)puVar1[1].prev & 4) != 0)) {
      uVar3 = *(int *)&puVar1[-1].next - 1;
      pcVar4 = "<unknown>";
      if (uVar3 < 0x10) {
        pcVar4 = &DAT_0020d880 + *(int *)(&DAT_0020d880 + (ulong)uVar3 * 4);
      }
      puVar2 = puVar1[1].prev;
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",(ulong)(uint)(int)"R-"[((ulong)puVar2 & 8) == 0],
              (ulong)(uint)(int)"A-"[((ulong)puVar2 & 4) == 0],
              (ulong)(uint)(int)"I-"[((ulong)puVar2 & 0x10) == 0],pcVar4,puVar1 + -2);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, void* stream) {
  const char* type;
  struct uv__queue* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  if (stream == NULL)
    stream = stderr;

  uv__queue_foreach(q, &loop->handle_queue) {
    h = uv__queue_data(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}